

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void Catch::anon_unknown_26::printSummaryRow
               (ostream *stream,ColourImpl *colour,StringRef label,
               vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
               *cols,size_t row)

{
  int iVar1;
  ostream *poVar2;
  string *psVar3;
  long in_stack_00000008;
  char local_61;
  ColourGuard local_60;
  ColourGuard local_50;
  char *local_40;
  size_type local_38;
  
  local_38 = label.m_size;
  local_40 = label.m_start;
  if (cols != (vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
               *)row) {
    do {
      psVar3 = &(cols[2].
                 super__Vector_base<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_suffix + in_stack_00000008;
      if ((cols->
          super__Vector_base<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
          )._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        poVar2 = (ostream *)std::ostream::write((char *)stream,(long)local_40);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
        iVar1 = std::__cxx11::string::compare((char *)psVar3);
        if (iVar1 == 0) {
          local_60.m_code = BrightYellow;
          local_60.m_engaged = false;
          local_60.m_colourImpl = colour;
          ColourImpl::ColourGuard::engageImpl(&local_60,stream);
          std::__ostream_insert<char,std::char_traits<char>>(stream,"- none -",8);
          if (local_60.m_engaged == true) {
            (*(local_60.m_colourImpl)->_vptr_ColourImpl[2])(local_60.m_colourImpl,0);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    (stream,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
        }
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)psVar3);
        if (iVar1 != 0) {
          local_60.m_code = FileName;
          local_60.m_engaged = false;
          local_60.m_colourImpl = colour;
          ColourImpl::ColourGuard::engageImpl(&local_60,stream);
          std::__ostream_insert<char,std::char_traits<char>>(stream," | ",3);
          local_50.m_code =
               *(Code *)&cols[1].
                         super__Vector_base<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
          local_50.m_engaged = false;
          local_50.m_colourImpl = colour;
          ColourImpl::ColourGuard::engageImpl(&local_50,stream);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (stream,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
          local_61 = ' ';
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_61,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,(char *)(cols->
                                    super__Vector_base<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                                    )._M_impl.super__Vector_impl_data._M_start,
                     (long)(cols->
                           super__Vector_base<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
          if (local_50.m_engaged == true) {
            (*(local_50.m_colourImpl)->_vptr_ColourImpl[2])(local_50.m_colourImpl,0);
          }
          if (local_60.m_engaged == true) {
            (*(local_60.m_colourImpl)->_vptr_ColourImpl[2])(local_60.m_colourImpl,0);
          }
        }
      }
      cols = cols + 3;
    } while (cols != (vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                      *)row);
  }
  local_60.m_colourImpl = (ColourImpl *)CONCAT71(local_60.m_colourImpl._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_60,1);
  return;
}

Assistant:

void printSummaryRow( std::ostream& stream,
                              ColourImpl& colour,
                              StringRef label,
                              std::vector<SummaryColumn> const& cols,
                              std::size_t row ) {
            for ( auto const& col : cols ) {
                auto const& value = col.getRow( row );
                auto const& suffix = col.getSuffix();
                if ( suffix.empty() ) {
                    stream << label << ": ";
                    if ( value != "0" ) {
                        stream << value;
                    } else {
                        stream << colour.guardColour( Colour::Warning )
                               << "- none -";
                    }
                } else if ( value != "0" ) {
                    stream << colour.guardColour( Colour::LightGrey ) << " | "
                           << colour.guardColour( col.getColour() ) << value
                           << ' ' << suffix;
                }
            }
            stream << '\n';
        }